

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

void __thiscall HighsIis::addCol(HighsIis *this,HighsInt col,HighsInt status)

{
  value_type_conflict2 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void HighsIis::addCol(const HighsInt col, const HighsInt status) {
  this->col_index_.push_back(col);
  this->col_bound_.push_back(status);
}